

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteEscapedString(BinaryWriterSpec *this,string_view s)

{
  byte bVar1;
  size_t sVar2;
  undefined1 local_2a;
  undefined1 local_29;
  
  local_2a = 0x22;
  Stream::WriteData(this->json_stream_,&local_2a,1,(char *)0x0,No);
  if (s._M_len != 0) {
    sVar2 = 0;
    do {
      bVar1 = s._M_str[sVar2];
      if (((bVar1 < 0x20) || (bVar1 == 0x5c)) || (bVar1 == 0x22)) {
        Stream::Writef(this->json_stream_,"\\u%04x");
      }
      else {
        Stream::WriteU8(this->json_stream_,(uint)bVar1,(char *)0x0,No);
      }
      sVar2 = sVar2 + 1;
    } while (s._M_len != sVar2);
  }
  local_29 = 0x22;
  Stream::WriteData(this->json_stream_,&local_29,1,(char *)0x0,No);
  return;
}

Assistant:

void BinaryWriterSpec::WriteEscapedString(std::string_view s) {
  json_stream_->WriteChar('"');
  for (size_t i = 0; i < s.length(); ++i) {
    uint8_t c = s[i];
    if (c < 0x20 || c == '\\' || c == '"') {
      json_stream_->Writef("\\u%04x", c);
    } else {
      json_stream_->WriteChar(c);
    }
  }
  json_stream_->WriteChar('"');
}